

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

void anm_replace(anm_archive_t *anm,FILE *anmfp,char *name,char *filename)

{
  ushort uVar1;
  ushort uVar2;
  long *plVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  image_t *__ptr;
  uchar *__ptr_00;
  uchar *converted_data;
  list_node_t *plStack_78;
  uint y;
  list_node_t *node;
  anm_entry_t *entry;
  long offset;
  image_t *image;
  uint local_50;
  uint height;
  uint width;
  uint f;
  format_t formats [5];
  char *filename_local;
  char *name_local;
  FILE *anmfp_local;
  anm_archive_t *anm_local;
  
  _width = 0x1ffffffff;
  formats[0] = FORMAT_RGB565;
  formats[1] = FORMAT_ARGB4444;
  formats[2] = FORMAT_GRAY8;
  local_50 = 0;
  image._4_4_ = 0;
  unique0x100004da = filename;
  util_total_entry_size(anm,name,&local_50,(uint *)((long)&image + 4));
  if ((local_50 != 0) && (image._4_4_ != 0)) {
    __ptr = png_read(stack0xffffffffffffffd0);
    if ((local_50 != __ptr->width) || (image._4_4_ != __ptr->height)) {
      fprintf(_stderr,"%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",argv0,
              current_input,name,stack0xffffffffffffffd0,__ptr->width,__ptr->height,local_50,
              image._4_4_);
      exit(1);
    }
    for (height = 0; height < 5; height = height + 1) {
      entry = (anm_entry_t *)0x0;
      for (plStack_78 = (anm->entries).head; plStack_78 != (list_node_t *)0x0;
          plStack_78 = plStack_78->next) {
        plVar3 = (long *)plStack_78->data;
        if ((((char *)plVar3[2] == name) && ((uint)*(ushort *)(plVar3[1] + 6) == (&width)[height]))
           && (*(short *)(*plVar3 + 0x34) != 0)) {
          __ptr_00 = format_from_rgba((uint32_t *)__ptr->data,local_50 * image._4_4_,
                                      (&width)[height]);
          if (anmfp == (FILE *)0x0) {
            for (converted_data._4_4_ = *(uint *)(*plVar3 + 0x24);
                converted_data._4_4_ < *(int *)(*plVar3 + 0x24) + (uint)*(ushort *)(plVar3[1] + 10);
                converted_data._4_4_ = converted_data._4_4_ + 1) {
              lVar4 = plVar3[8];
              iVar6 = *(int *)(*plVar3 + 0x24);
              uVar1 = *(ushort *)(plVar3[1] + 8);
              uVar8 = format_Bpp((&width)[height]);
              iVar10 = converted_data._4_4_ * local_50;
              uVar5 = format_Bpp((&width)[height]);
              iVar7 = *(int *)(*plVar3 + 0x20);
              uVar9 = format_Bpp((&width)[height]);
              uVar2 = *(ushort *)(plVar3[1] + 8);
              uVar11 = format_Bpp((&width)[height]);
              memcpy((void *)(lVar4 + (ulong)((converted_data._4_4_ - iVar6) * (uint)uVar1 * uVar8))
                     ,__ptr_00 + (ulong)(iVar7 * uVar9) + (ulong)(iVar10 * uVar5),
                     (ulong)(uVar2 * uVar11));
            }
          }
          else {
            for (converted_data._4_4_ = *(uint *)(*plVar3 + 0x24);
                converted_data._4_4_ < *(int *)(*plVar3 + 0x24) + (uint)*(ushort *)(plVar3[1] + 10);
                converted_data._4_4_ = converted_data._4_4_ + 1) {
              uVar8 = *(uint *)(*plVar3 + 0x30);
              iVar6 = *(int *)(*plVar3 + 0x24);
              uVar1 = *(ushort *)(plVar3[1] + 8);
              uVar5 = format_Bpp((&width)[height]);
              iVar6 = file_seek(anmfp,(long)&entry->name +
                                      (ulong)((converted_data._4_4_ - iVar6) * (uint)uVar1 * uVar5)
                                      + (ulong)uVar8);
              if (iVar6 == 0) {
                exit(1);
              }
              iVar7 = converted_data._4_4_ * local_50;
              uVar8 = format_Bpp((&width)[height]);
              iVar6 = *(int *)(*plVar3 + 0x20);
              uVar5 = format_Bpp((&width)[height]);
              uVar1 = *(ushort *)(plVar3[1] + 8);
              uVar9 = format_Bpp((&width)[height]);
              iVar6 = file_write(anmfp,__ptr_00 + (ulong)(iVar6 * uVar5) + (ulong)(iVar7 * uVar8),
                                 (ulong)(uVar1 * uVar9));
              if (iVar6 == 0) {
                exit(1);
              }
            }
          }
          free(__ptr_00);
        }
        entry = (anm_entry_t *)((long)&entry->header + (ulong)*(uint *)(*plVar3 + 0x38));
      }
    }
    free(__ptr->data);
    free(__ptr);
  }
  return;
}

Assistant:

static void
anm_replace(
    const anm_archive_t* anm,
    FILE* anmfp,
    const char* name,
    const char* filename)
{
    const format_t formats[] = {
        FORMAT_RGBA8888,
        FORMAT_BGRA8888,
        FORMAT_RGB565,
        FORMAT_ARGB4444,
        FORMAT_GRAY8
    };
    unsigned int f;
    unsigned int width = 0;
    unsigned int height = 0;
    image_t* image;

    util_total_entry_size(anm, name, &width, &height);
    if (width == 0 || height == 0) {
        /* There's nothing to do. */
        return;
    }

    image = png_read(filename);

    if (width != image->width || height != image->height) {
        fprintf(stderr,
            "%s:%s:%s: wrong image dimensions for %s: %u, %u instead of %u, %u\n",
            argv0, current_input, name, filename, image->width, image->height,
            width, height);
        exit(1);
    }

    for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {

        long offset = 0;
        anm_entry_t* entry;
        list_for_each(&anm->entries, entry) {
            if (entry->name == name &&
                entry->thtx->format == formats[f] &&
                entry->header->hasdata) {
                unsigned int y;

                unsigned char* converted_data = format_from_rgba((uint32_t*)image->data, width * height, formats[f]);

                if (anmfp) {
                    for (y = entry->header->y; y < entry->header->y + entry->thtx->h; ++y) {
                        if (!file_seek(anmfp,
                            offset + entry->header->thtxoffset + sizeof(thtx_header_t) + (y - entry->header->y) * entry->thtx->w * format_Bpp(formats[f])))
                            exit(1);
                        if (!file_write(anmfp, converted_data + y * width * format_Bpp(formats[f]) + entry->header->x * format_Bpp(formats[f]), entry->thtx->w * format_Bpp(formats[f])))
                            exit(1);
                    }
                } else {
                    for (y = entry->header->y; y < entry->header->y + entry->thtx->h; ++y) {
                        memcpy(entry->data + (y - entry->header->y) * entry->thtx->w * format_Bpp(formats[f]),
                               converted_data + y * width * format_Bpp(formats[f]) + entry->header->x * format_Bpp(formats[f]),
                               entry->thtx->w * format_Bpp(formats[f]));
                    }
                }

                free(converted_data);
            }

            offset += entry->header->nextoffset;
        }
    }

    free(image->data);
    free(image);
}